

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapBoxedValue
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  Var value;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapBoxedValueObject) {
    if (snpObject->AddtlSnapObjectInfo == (TTDVar)0x0) {
      value = (Var)0x0;
    }
    else {
      value = InflateMap::InflateTTDVar(inflator,snpObject->AddtlSnapObjectInfo);
    }
    Js::JavascriptLibrary::SetBoxedObjectValue_TTD
              ((pSVar1->super_ScriptContextBase).javascriptLibrary,obj,value);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void DoAddtlValueInstantiation_SnapBoxedValue(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            TTDVar snapBoxedVar = SnapObjectGetAddtlInfoAs<TTDVar, SnapObjectType::SnapBoxedValueObject>(snpObject);
            Js::Var jsvar = (snapBoxedVar != nullptr) ? inflator->InflateTTDVar(snapBoxedVar) : nullptr;

            ctx->GetLibrary()->SetBoxedObjectValue_TTD(obj, jsvar);
        }